

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O1

int codebook_decode_deinterleave_repeat
              (vorb *f,Codebook *c,float **outputs,int ch,int *c_inter_p,int *p_inter_p,int len,
              int total_decode)

{
  byte bVar1;
  codetype *pcVar2;
  float *pfVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  bool bVar13;
  float fVar14;
  
  if (c->lookup_type == '\0') {
    f->error = VORBIS_invalid_stream;
  }
  else {
    uVar5 = (ulong)(uint)c->dimensions;
    iVar9 = *p_inter_p;
    iVar11 = *c_inter_p;
    do {
      if (total_decode < 1) {
        *c_inter_p = iVar11;
        *p_inter_p = iVar9;
        return 1;
      }
      if (f->valid_bits < 10) {
        if (f->valid_bits == 0) {
          f->acc = 0;
        }
        do {
          if (((f->last_seg != 0) && (f->bytes_in_seg == '\0')) ||
             (iVar4 = get8_packet_raw(f), iVar4 == -1)) break;
          iVar6 = f->valid_bits;
          f->acc = f->acc + (iVar4 << ((byte)iVar6 & 0x1f));
          f->valid_bits = iVar6 + 8;
        } while (iVar6 < 0x11);
      }
      iVar4 = (int)c->fast_huffman[f->acc & 0x3ff];
      if (c->fast_huffman[f->acc & 0x3ff] < 0) {
        iVar4 = codebook_decode_scalar_raw(f,c);
      }
      else {
        bVar1 = c->codeword_lengths[iVar4];
        f->acc = f->acc >> (bVar1 & 0x1f);
        iVar6 = f->valid_bits - (uint)bVar1;
        bVar13 = iVar6 < 0;
        if (iVar6 < 1) {
          iVar6 = 0;
        }
        if (bVar13) {
          iVar4 = -1;
        }
        f->valid_bits = iVar6;
      }
      if (iVar4 < 0) {
        if ((f->bytes_in_seg != '\0') || (f->last_seg == 0)) {
          f->error = VORBIS_invalid_stream;
        }
      }
      else {
        uVar10 = (ulong)(uint)((len * ch - iVar9 * ch) + iVar11);
        if ((int)uVar5 + iVar11 + iVar9 * ch <= len * ch) {
          uVar10 = uVar5;
        }
        uVar5 = uVar10;
        iVar7 = c->dimensions * iVar4;
        iVar6 = (int)uVar5;
        if (c->sequence_p == '\0') {
          if (0 < iVar6) {
            lVar8 = (long)iVar7;
            uVar10 = uVar5;
            do {
              pfVar3 = outputs[iVar11];
              if (pfVar3 != (float *)0x0) {
                pfVar3[iVar9] = c->multiplicands[lVar8] + 0.0 + pfVar3[iVar9];
              }
              iVar7 = iVar11 + 1;
              iVar11 = iVar7;
              if (iVar7 == ch) {
                iVar11 = 0;
              }
              iVar9 = iVar9 + (uint)(iVar7 == ch);
              lVar8 = lVar8 + 1;
              uVar10 = uVar10 - 1;
            } while (uVar10 != 0);
          }
        }
        else if (0 < iVar6) {
          pcVar2 = c->multiplicands;
          fVar14 = 0.0;
          uVar10 = 0;
          do {
            fVar14 = fVar14 + pcVar2[(long)iVar7 + uVar10];
            pfVar3 = outputs[iVar11];
            if (pfVar3 != (float *)0x0) {
              pfVar3[iVar9] = pfVar3[iVar9] + fVar14;
            }
            iVar12 = iVar11 + 1;
            iVar11 = iVar12;
            if (iVar12 == ch) {
              iVar11 = 0;
            }
            iVar9 = iVar9 + (uint)(iVar12 == ch);
            uVar10 = uVar10 + 1;
          } while (uVar5 != uVar10);
        }
        total_decode = total_decode - iVar6;
      }
    } while (-1 < iVar4);
  }
  return 0;
}

Assistant:

static int codebook_decode_deinterleave_repeat(vorb *f, Codebook *c, float **outputs, int ch, int *c_inter_p, int *p_inter_p, int len, int total_decode)
{
   int c_inter = *c_inter_p;
   int p_inter = *p_inter_p;
   int i,z, effective = c->dimensions;

   // type 0 is only legal in a scalar context
   if (c->lookup_type == 0)   return error(f, VORBIS_invalid_stream);

   while (total_decode > 0) {
      float last = CODEBOOK_ELEMENT_BASE(c);
      DECODE_VQ(z,f,c);
      #ifndef STB_VORBIS_DIVIDES_IN_CODEBOOK
      assert(!c->sparse || z < c->sorted_entries);
      #endif
      if (z < 0) {
         if (!f->bytes_in_seg)
            if (f->last_seg) return FALSE;
         return error(f, VORBIS_invalid_stream);
      }

      // if this will take us off the end of the buffers, stop short!
      // we check by computing the length of the virtual interleaved
      // buffer (len*ch), our current offset within it (p_inter*ch)+(c_inter),
      // and the length we'll be using (effective)
      if (c_inter + p_inter*ch + effective > len * ch) {
         effective = len*ch - (p_inter*ch - c_inter);
      }

   #ifdef STB_VORBIS_DIVIDES_IN_CODEBOOK
      if (c->lookup_type == 1) {
         int div = 1;
         for (i=0; i < effective; ++i) {
            int off = (z / div) % c->lookup_values;
            float val = CODEBOOK_ELEMENT_FAST(c,off) + last;
            if (outputs[c_inter])
               outputs[c_inter][p_inter] += val;
            if (++c_inter == ch) { c_inter = 0; ++p_inter; }
            if (c->sequence_p) last = val;
            div *= c->lookup_values;
         }
      } else
   #endif
      {
         z *= c->dimensions;
         if (c->sequence_p) {
            for (i=0; i < effective; ++i) {
               float val = CODEBOOK_ELEMENT_FAST(c,z+i) + last;
               if (outputs[c_inter])
                  outputs[c_inter][p_inter] += val;
               if (++c_inter == ch) { c_inter = 0; ++p_inter; }
               last = val;
            }
         } else {
            for (i=0; i < effective; ++i) {
               float val = CODEBOOK_ELEMENT_FAST(c,z+i) + last;
               if (outputs[c_inter])
                  outputs[c_inter][p_inter] += val;
               if (++c_inter == ch) { c_inter = 0; ++p_inter; }
            }
         }
      }

      total_decode -= effective;
   }
   *c_inter_p = c_inter;
   *p_inter_p = p_inter;
   return TRUE;
}